

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Marshall.c
# Opt level: O0

WJTL_STATUS TestMarshallBools(void)

{
  WJTL_STATUS WVar1;
  undefined1 local_79;
  undefined1 local_78 [5];
  _Bool _result_1;
  _Bool _result;
  BoolStruct theStruct;
  JlMarshallElement marshalBoolStruct [1];
  WJTL_STATUS local_c;
  WJTL_STATUS TestReturn;
  
  local_c = WJTL_STATUS_SUCCESS;
  memcpy(local_78,&DAT_001502b0,0x60);
  memset(&local_79,0,1);
  local_79 = 1;
  WVar1 = MakeJsonAndVerify(&local_79,(JlMarshallElement *)local_78,1,"{\"b\":true}");
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(MakeJsonAndVerify( &theStruct, marshalBoolStruct, ( sizeof(marshalBoolStruct) / sizeof((marshalBoolStruct)[0]) ), \"{\\\"b\\\":true}\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Marshall.c"
                   ,"TestMarshallBools",0x1b9);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    local_c = WJTL_STATUS_FAILED;
  }
  local_79 = 0;
  WVar1 = MakeJsonAndVerify(&local_79,(JlMarshallElement *)local_78,1,"{\"b\":false}");
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(MakeJsonAndVerify( &theStruct, marshalBoolStruct, ( sizeof(marshalBoolStruct) / sizeof((marshalBoolStruct)[0]) ), \"{\\\"b\\\":false}\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Marshall.c"
                   ,"TestMarshallBools",0x1bc);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    local_c = WJTL_STATUS_FAILED;
  }
  return local_c;
}

Assistant:

static
WJTL_STATUS
    TestMarshallBools
    (
        void
    )
{
    WJTL_STATUS TestReturn = WJTL_STATUS_SUCCESS;

    typedef struct
    {
        bool BoolValue;
    } BoolStruct;

    JlMarshallElement marshalBoolStruct[] =
    {
        JlMarshallBool( BoolStruct, BoolValue, "b" ),
    };

    BoolStruct theStruct = {0};

    theStruct.BoolValue = true;
    JL_ASSERT_SUCCESS( MakeJsonAndVerify( &theStruct, marshalBoolStruct, NumElements(marshalBoolStruct), "{\"b\":true}" ) );

    theStruct.BoolValue = false;
    JL_ASSERT_SUCCESS( MakeJsonAndVerify( &theStruct, marshalBoolStruct, NumElements(marshalBoolStruct), "{\"b\":false}" ) );

    return TestReturn;
}